

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc-pico.c
# Opt level: O3

void pico_on_acked(quicly_cc_t *cc,quicly_loss_t *loss,uint32_t bytes,uint64_t largest_acked,
                  uint32_t inflight,int64_t now,uint32_t max_udp_payload_size)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  double dVar4;
  
  if (bytes <= inflight) {
    if (cc->recovery_end <= largest_acked) {
      uVar2 = bytes + (cc->state).reno.stash;
      *(uint *)&cc->state = uVar2;
      uVar1 = cc->cwnd;
      dVar4 = (double)max_udp_payload_size / (double)uVar1;
      if (uVar1 < cc->ssthresh) {
        dVar4 = dVar4 + 1.0;
      }
      else {
        dVar4 = dVar4 + (double)(loss->rtt).smoothed * 0.0004285714285714286;
      }
      uVar3 = (ulong)((double)max_udp_payload_size / dVar4);
      if ((uint)uVar3 <= uVar2) {
        uVar3 = uVar3 & 0xffffffff;
        uVar1 = (int)(uVar2 / uVar3) * max_udp_payload_size + uVar1;
        cc->cwnd = uVar1;
        (cc->state).reno.stash = (uint32_t)((ulong)uVar2 % uVar3);
        if (cc->cwnd_maximum < uVar1) {
          cc->cwnd_maximum = uVar1;
        }
      }
    }
    return;
  }
  __assert_fail("inflight >= bytes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/cc-pico.c"
                ,0x31,
                "void pico_on_acked(quicly_cc_t *, const quicly_loss_t *, uint32_t, uint64_t, uint32_t, int64_t, uint32_t)"
               );
}

Assistant:

static void pico_on_acked(quicly_cc_t *cc, const quicly_loss_t *loss, uint32_t bytes, uint64_t largest_acked, uint32_t inflight,
                          int64_t now, uint32_t max_udp_payload_size)
{
    assert(inflight >= bytes);

    /* Do not increase congestion window while in recovery. */
    if (largest_acked < cc->recovery_end)
        return;

    cc->state.reno.stash += bytes;

    /* Calculate the amount of bytes required to be acked for incrementing CWND by one MTU. */
    uint32_t bytes_per_mtu_increase = calc_bytes_per_mtu_increase(cc->cwnd, cc->ssthresh, loss->rtt.smoothed, max_udp_payload_size);

    /* Bail out if we do not yet have enough bytes being acked. */
    if (cc->state.reno.stash < bytes_per_mtu_increase)
        return;

    /* Update CWND, reducing stash relative to the amount we've adjusted the CWND */
    uint32_t count = cc->state.reno.stash / bytes_per_mtu_increase;
    cc->cwnd += count * max_udp_payload_size;
    cc->state.reno.stash -= count * bytes_per_mtu_increase;

    if (cc->cwnd_maximum < cc->cwnd)
        cc->cwnd_maximum = cc->cwnd;
}